

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::GraphicsPipelineStateCreateInfoX::GraphicsPipelineStateCreateInfoX
          (GraphicsPipelineStateCreateInfoX *this,GraphicsPipelineStateCreateInfo *CI)

{
  InputLayoutDesc *pIVar1;
  GraphicsPipelineStateCreateInfo *CI_local;
  GraphicsPipelineStateCreateInfoX *this_local;
  
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  ::PipelineStateCreateInfoX
            (&this->
              super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
             ,CI);
  InputLayoutDescX::InputLayoutDescX(&this->InputLayout,&(CI->GraphicsPipeline).InputLayout);
  pIVar1 = InputLayoutDescX::operator_cast_to_InputLayoutDesc_(&this->InputLayout);
  (this->
  super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  ).super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.InputLayout.LayoutElements =
       pIVar1->LayoutElements;
  (this->
  super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  ).super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.InputLayout.NumElements =
       pIVar1->NumElements;
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pVS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pVS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pPS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pPS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pDS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pDS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pHS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pHS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pGS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pGS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pAS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pAS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.pMS != (IShader *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IShader*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.pMS);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      ).super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.pRenderPass != (IRenderPass *)0x0) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IRenderPass*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&(this->
                   super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                   ).Objects,
               &(this->
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
                ).super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.pRenderPass);
  }
  return;
}

Assistant:

GraphicsPipelineStateCreateInfoX(const GraphicsPipelineStateCreateInfo& CI) :
        PipelineStateCreateInfoX{CI},
        InputLayout{CI.GraphicsPipeline.InputLayout}
    {
        GraphicsPipeline.InputLayout = InputLayout;

        if (pVS != nullptr) Objects.emplace_back(pVS);
        if (pPS != nullptr) Objects.emplace_back(pPS);
        if (pDS != nullptr) Objects.emplace_back(pDS);
        if (pHS != nullptr) Objects.emplace_back(pHS);
        if (pGS != nullptr) Objects.emplace_back(pGS);
        if (pAS != nullptr) Objects.emplace_back(pAS);
        if (pMS != nullptr) Objects.emplace_back(pMS);

        if (GraphicsPipeline.pRenderPass != nullptr)
            Objects.emplace_back(GraphicsPipeline.pRenderPass);
    }